

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<int_*,_bool>
HighsHashTree<int,_int>::insert_into_leaf<3>
          (NodePtr *insertNode,InnerLeaf<3> *leaf,uint64_t hash,int hashPos,
          HighsHashTableEntry<int,_int> *entry)

{
  InnerLeaf<4> *this;
  pair<int_*,_bool> pVar1;
  
  if (leaf->size != 0x26) {
    pVar1 = InnerLeaf<3>::insert_entry(leaf,hash,hashPos,entry);
    return pVar1;
  }
  pVar1.first = InnerLeaf<3>::find_entry(leaf,hash,hashPos,&entry->key_);
  if (pVar1.first != (ValueType *)0x0) {
    pVar1._8_8_ = 0;
    return pVar1;
  }
  this = (InnerLeaf<4> *)operator_new(0x378);
  InnerLeaf<4>::InnerLeaf<3>(this,leaf);
  insertNode->ptrAndType = (ulong)this | 5;
  operator_delete(leaf);
  pVar1 = InnerLeaf<4>::insert_entry(this,hash,hashPos,entry);
  return pVar1;
}

Assistant:

static std::pair<ValueType*, bool> insert_into_leaf(
      NodePtr* insertNode, InnerLeaf<SizeClass>* leaf, uint64_t hash,
      int hashPos, HighsHashTableEntry<K, V>& entry) {
    if (leaf->size == InnerLeaf<SizeClass>::capacity()) {
      auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
      if (existingEntry) return std::make_pair(existingEntry, false);

      InnerLeaf<SizeClass + 1>* newLeaf =
          new InnerLeaf<SizeClass + 1>(std::move(*leaf));
      *insertNode = newLeaf;
      delete leaf;
      return newLeaf->insert_entry(hash, hashPos, entry);
    }

    return leaf->insert_entry(hash, hashPos, entry);
  }